

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O1

void Ssc_GiaClassesInit(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Rpr_t *pGVar3;
  int *piVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                  ,0x10d,"void Ssc_GiaClassesInit(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar3;
  piVar4 = (int *)calloc((long)iVar1,4);
  p->pNexts = piVar4;
  if (0 < p->nObjs) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(uint *)(&p->pObjs->field_0x0 + lVar5);
      bVar9 = (~uVar2 & 0x1fffffff) != 0;
      bVar10 = (~uVar2 & 0x9fffffff) == 0;
      uVar8 = 0;
      if (!bVar10 && (!bVar9 || -1 >= (int)uVar2)) {
        uVar8 = 0xfffffff;
      }
      if (uVar7 <= uVar8 && (bVar10 || bVar9 && -1 < (int)uVar2)) {
        __assert_fail("Num == GIA_VOID || Num < Id",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
      }
      p->pReprs[uVar7] = (Gia_Rpr_t)((uint)p->pReprs[uVar7] & 0xf0000000 | (uint)uVar8);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0xc;
    } while ((long)uVar7 < (long)p->nObjs);
  }
  if (p->vClassOld == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar6->pArray = piVar4;
    p->vClassOld = pVVar6;
  }
  if (p->vClassNew == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar6->pArray = piVar4;
    p->vClassNew = pVVar6;
  }
  return;
}

Assistant:

void Ssc_GiaClassesInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjSetRepr( p, i, Gia_ObjIsCand(pObj) ? 0 : GIA_VOID );
    if ( p->vClassOld == NULL )
        p->vClassOld = Vec_IntAlloc( 100 );
    if ( p->vClassNew == NULL )
        p->vClassNew = Vec_IntAlloc( 100 );
}